

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type.cpp
# Opt level: O0

void __thiscall
yactfr::TraceType::TraceType
          (TraceType *this,uint majorVersion,uint minorVersion,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ns,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *name,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *uid,TraceEnvironment *env,Up *pktHeaderType,ClockTypeSet *clkTypes,
          DataStreamTypeSet *dsts,Up *attrs)

{
  int iVar1;
  pointer this_00;
  ostream *this_01;
  string local_88;
  PktProc *local_58;
  PktProc *pktProc;
  char *var;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *uid_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *name_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ns_local;
  uint minorVersion_local;
  uint majorVersion_local;
  TraceType *this_local;
  
  var = (char *)uid;
  uid_local = name;
  name_local = ns;
  ns_local._0_4_ = minorVersion;
  ns_local._4_4_ = majorVersion;
  _minorVersion_local = this;
  std::
  make_unique<yactfr::internal::TraceTypeImpl,unsigned_int_const&,unsigned_int_const&,boost::optional<std::__cxx11::string>,boost::optional<std::__cxx11::string>,boost::optional<std::__cxx11::string>,yactfr::TraceEnvironment,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::set<std::unique_ptr<yactfr::ClockType_const,std::default_delete<yactfr::ClockType_const>>,yactfr::internal::ClkTypeAddrComp,std::allocator<std::unique_ptr<yactfr::ClockType_const,std::default_delete<yactfr::ClockType_const>>>>,std::set<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>,yactfr::internal::DstIdComp,std::allocator<std::unique_ptr<yactfr::DataStreamType_const,std::default_delete<yactfr::DataStreamType_const>>>>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,yactfr::TraceType&>
            ((uint *)this,(uint *)((long)&ns_local + 4),
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ns_local,ns,name,(TraceEnvironment *)uid,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)env,(set<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>,_yactfr::internal::ClkTypeAddrComp,_std::allocator<std::unique_ptr<const_yactfr::ClockType,_std::default_delete<const_yactfr::ClockType>_>_>_>
                     *)pktHeaderType,
             (set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
              *)clkTypes,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)dsts,
             (TraceType *)attrs);
  pktProc = (PktProc *)getenv("YACTFR_DEBUG_PRINT_PROC");
  if (pktProc != (PktProc *)0x0) {
    iVar1 = strcmp((char *)pktProc,"1");
    if (iVar1 == 0) {
      this_00 = std::
                unique_ptr<yactfr::internal::TraceTypeImpl,_std::default_delete<yactfr::internal::TraceTypeImpl>_>
                ::operator->(&this->_pimpl);
      local_58 = internal::TraceTypeImpl::pktProc(this_00);
      internal::PktProc::toStr_abi_cxx11_(&local_88,local_58,0);
      this_01 = std::operator<<((ostream *)&std::cout,(string *)&local_88);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  return;
}

Assistant:

TraceType::TraceType(const unsigned int majorVersion, const unsigned int minorVersion,
                     boost::optional<std::string> ns, boost::optional<std::string> name,
                     boost::optional<std::string> uid, TraceEnvironment env,
                     StructureType::Up pktHeaderType, ClockTypeSet&& clkTypes,
                     DataStreamTypeSet&& dsts, MapItem::Up attrs) :
    _pimpl {
        std::make_unique<internal::TraceTypeImpl>(majorVersion, minorVersion, std::move(ns),
                                                  std::move(name), std::move(uid), std::move(env),
                                                  std::move(pktHeaderType), std::move(clkTypes),
                                                  std::move(dsts), std::move(attrs), *this)
    }
{
#ifndef NDEBUG
    const auto var = std::getenv("YACTFR_DEBUG_PRINT_PROC");

    if (var && std::strcmp(var, "1") == 0) {
        auto& pktProc = _pimpl->pktProc();
        std::cout << pktProc.toStr(0) << std::endl;
    }
#endif
}